

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

string * mac2string_abi_cxx11_(string *__return_storage_ptr__,uint64_t mac)

{
  ostream *poVar1;
  ostringstream out;
  undefined8 uStack_180;
  uint auStack_178 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
  *(uint *)((long)auStack_178 + *(long *)(_out + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(_out + -0x18)) & 0xffffffb5 | 8;
  std::operator<<((ostringstream *)&out,0x30);
  *(undefined8 *)((long)&uStack_180 + *(long *)(_out + -0x18)) = 2;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&out);
  poVar1 = std::operator<<(poVar1,':');
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,':');
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,':');
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,':');
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,':');
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

inline std::string mac2string(const uint64_t mac)
{
  std::ostringstream out;

  out << std::hex << std::setfill('0');
  out << std::setw(2) << ((mac>>40)&0xff) << ':' << std::setw(2) << ((mac>>32)&0xff) << ':'
      << std::setw(2) << ((mac>>24)&0xff) << ':' << std::setw(2) << ((mac>>16)&0xff) << ':'
      << std::setw(2) << ((mac>>8)&0xff) << ':' << std::setw(2) << (mac&0xff);

  return out.str();
}